

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateDynamicMethodIsInitialized
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  JavaType JVar4;
  Label LVar5;
  uint uVar6;
  int iVar7;
  Descriptor *pDVar8;
  FileDescriptor *descriptor;
  OneofDescriptor *pOVar9;
  OneofGeneratorInfo *value1;
  ClassNameResolver *pCVar10;
  int i_00;
  string local_e8;
  string local_c8;
  string local_a8;
  OneofGeneratorInfo *local_88;
  OneofGeneratorInfo *oneof_info;
  OneofDescriptor *oneof;
  string local_68;
  FieldGeneratorInfo *local_48;
  FieldGeneratorInfo *info_1;
  FieldDescriptor *field_1;
  FieldGeneratorInfo *pFStack_30;
  int i_1;
  FieldGeneratorInfo *info;
  FieldDescriptor *field;
  Printer *pPStack_18;
  int i;
  Printer *printer_local;
  ImmutableMessageLiteGenerator *this_local;
  
  pPStack_18 = printer;
  printer_local = (Printer *)this;
  bVar2 = HasRequiredFields((this->super_MessageGenerator).descriptor_);
  if (bVar2) {
    io::Printer::Print(pPStack_18,
                       "byte isInitialized = memoizedIsInitialized;\nif (isInitialized == 1) return DEFAULT_INSTANCE;\nif (isInitialized == 0) return null;\n\nboolean shouldMemoize = ((Boolean) arg0).booleanValue();\n"
                      );
    for (field._4_4_ = 0; iVar7 = field._4_4_,
        iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_), iVar7 < iVar3;
        field._4_4_ = field._4_4_ + 1) {
      info = (FieldGeneratorInfo *)
             Descriptor::field((this->super_MessageGenerator).descriptor_,field._4_4_);
      pFStack_30 = Context::GetFieldGeneratorInfo(this->context_,(FieldDescriptor *)info);
      bVar2 = FieldDescriptor::is_required((FieldDescriptor *)info);
      if (bVar2) {
        io::Printer::Print(pPStack_18,
                           "if (!has$name$()) {\n  if (shouldMemoize) {\n    memoizedIsInitialized = 0;\n  }\n  return null;\n}\n"
                           ,"name",&pFStack_30->capitalized_name);
      }
    }
    for (field_1._4_4_ = 0; iVar7 = field_1._4_4_,
        iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_), iVar7 < iVar3;
        field_1._4_4_ = field_1._4_4_ + 1) {
      info_1 = (FieldGeneratorInfo *)
               Descriptor::field((this->super_MessageGenerator).descriptor_,field_1._4_4_);
      local_48 = Context::GetFieldGeneratorInfo(this->context_,(FieldDescriptor *)info_1);
      JVar4 = GetJavaType((FieldDescriptor *)info_1);
      if (JVar4 == JAVATYPE_MESSAGE) {
        pDVar8 = FieldDescriptor::message_type((FieldDescriptor *)info_1);
        bVar2 = HasRequiredFields(pDVar8);
        if (bVar2) {
          LVar5 = FieldDescriptor::label((FieldDescriptor *)info_1);
          pPVar1 = pPStack_18;
          pCVar10 = (ClassNameResolver *)(ulong)LVar5;
          if (LVar5 == LABEL_OPTIONAL) {
            descriptor = Descriptor::file((this->super_MessageGenerator).descriptor_);
            bVar2 = SupportFieldPresence(descriptor);
            if ((bVar2) ||
               (pOVar9 = FieldDescriptor::containing_oneof((FieldDescriptor *)info_1),
               pOVar9 == (OneofDescriptor *)0x0)) {
              io::Printer::Print(pPStack_18,"if (has$name$()) {\n","name",
                                 &local_48->capitalized_name);
            }
            else {
              oneof_info = (OneofGeneratorInfo *)
                           FieldDescriptor::containing_oneof((FieldDescriptor *)info_1);
              value1 = Context::GetOneofGeneratorInfo(this->context_,(OneofDescriptor *)oneof_info);
              pPVar1 = pPStack_18;
              local_88 = value1;
              uVar6 = FieldDescriptor::number((FieldDescriptor *)info_1);
              SimpleItoa_abi_cxx11_(&local_a8,(protobuf *)(ulong)uVar6,i_00);
              io::Printer::Print(pPVar1,"if ($oneof_name$Case_ == $field_number$) {\n","oneof_name",
                                 &value1->name,"field_number",&local_a8);
              std::__cxx11::string::~string((string *)&local_a8);
            }
            io::Printer::Print(pPStack_18,
                               "  if (!get$name$().isInitialized()) {\n    if (shouldMemoize) {\n      memoizedIsInitialized = 0;\n    }\n    return null;\n  }\n}\n"
                               ,"name",&local_48->capitalized_name);
          }
          else if (LVar5 == LABEL_REQUIRED) {
            pCVar10 = this->name_resolver_;
            pDVar8 = FieldDescriptor::message_type((FieldDescriptor *)info_1);
            ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                      (&local_68,pCVar10,pDVar8);
            io::Printer::Print(pPVar1,
                               "if (!get$name$().isInitialized()) {\n  if (shouldMemoize) {\n    memoizedIsInitialized = 0;\n  }\n  return null;\n}\n"
                               ,"type",&local_68,"name",&local_48->capitalized_name);
            std::__cxx11::string::~string((string *)&local_68);
          }
          else if (LVar5 == LABEL_REPEATED) {
            pDVar8 = FieldDescriptor::message_type((FieldDescriptor *)info_1);
            bVar2 = IsMapEntry(pDVar8);
            pPVar1 = pPStack_18;
            if (bVar2) {
              pDVar8 = FieldDescriptor::message_type((FieldDescriptor *)info_1);
              (anonymous_namespace)::MapValueImmutableClassdName_abi_cxx11_
                        (&local_c8,(_anonymous_namespace_ *)pDVar8,
                         (Descriptor *)this->name_resolver_,pCVar10);
              io::Printer::Print(pPVar1,
                                 "for ($type$ item : get$name$Map().values()) {\n  if (!item.isInitialized()) {\n    if (shouldMemoize) {\n      memoizedIsInitialized = 0;\n    }\n    return null;\n  }\n}\n"
                                 ,"type",&local_c8,"name",&local_48->capitalized_name);
              std::__cxx11::string::~string((string *)&local_c8);
            }
            else {
              pCVar10 = this->name_resolver_;
              pDVar8 = FieldDescriptor::message_type((FieldDescriptor *)info_1);
              ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                        (&local_e8,pCVar10,pDVar8);
              io::Printer::Print(pPVar1,
                                 "for (int i = 0; i < get$name$Count(); i++) {\n  if (!get$name$(i).isInitialized()) {\n    if (shouldMemoize) {\n      memoizedIsInitialized = 0;\n    }\n    return null;\n  }\n}\n"
                                 ,"type",&local_e8,"name",&local_48->capitalized_name);
              std::__cxx11::string::~string((string *)&local_e8);
            }
          }
        }
      }
    }
    iVar7 = Descriptor::extension_range_count((this->super_MessageGenerator).descriptor_);
    if (0 < iVar7) {
      io::Printer::Print(pPStack_18,
                         "if (!extensionsAreInitialized()) {\n  if (shouldMemoize) {\n    memoizedIsInitialized = 0;\n  }\n  return null;\n}\n"
                        );
    }
    io::Printer::Print(pPStack_18,"if (shouldMemoize) memoizedIsInitialized = 1;\n");
    io::Printer::Print(pPStack_18,"return DEFAULT_INSTANCE;\n\n");
  }
  else {
    io::Printer::Print(pPStack_18,"return DEFAULT_INSTANCE;\n");
  }
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateDynamicMethodIsInitialized(
    io::Printer* printer) {
  // Returns null for false, DEFAULT_INSTANCE for true.
  if (!HasRequiredFields(descriptor_)) {
    printer->Print("return DEFAULT_INSTANCE;\n");
    return;
  }

  // Don't directly compare to -1 to avoid an Android x86 JIT bug.
  printer->Print(
    "byte isInitialized = memoizedIsInitialized;\n"
    "if (isInitialized == 1) return DEFAULT_INSTANCE;\n"
    "if (isInitialized == 0) return null;\n"
    "\n"
    "boolean shouldMemoize = ((Boolean) arg0).booleanValue();\n");

  // Check that all required fields in this message are set.
  // TODO(kenton):  We can optimize this when we switch to putting all the
  //   "has" fields into a single bitfield.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);

    if (field->is_required()) {
      printer->Print(
        "if (!has$name$()) {\n"
        "  if (shouldMemoize) {\n"
        "    memoizedIsInitialized = 0;\n"
        "  }\n"
        "  return null;\n"
        "}\n",
        "name", info->capitalized_name);
    }
  }

  // Now check that all embedded messages are initialized.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
    if (GetJavaType(field) == JAVATYPE_MESSAGE &&
        HasRequiredFields(field->message_type())) {
      switch (field->label()) {
        case FieldDescriptor::LABEL_REQUIRED:
          printer->Print(
            "if (!get$name$().isInitialized()) {\n"
            "  if (shouldMemoize) {\n"
            "    memoizedIsInitialized = 0;\n"
            "  }\n"
            "  return null;\n"
            "}\n",
            "type", name_resolver_->GetImmutableClassName(
                field->message_type()),
            "name", info->capitalized_name);
          break;
        case FieldDescriptor::LABEL_OPTIONAL:
          if (!SupportFieldPresence(descriptor_->file()) &&
              field->containing_oneof() != NULL) {
            const OneofDescriptor* oneof = field->containing_oneof();
            const OneofGeneratorInfo* oneof_info =
                context_->GetOneofGeneratorInfo(oneof);
            printer->Print(
              "if ($oneof_name$Case_ == $field_number$) {\n",
              "oneof_name", oneof_info->name,
              "field_number", SimpleItoa(field->number()));
          } else {
            printer->Print(
              "if (has$name$()) {\n",
              "name", info->capitalized_name);
          }
          printer->Print(
            "  if (!get$name$().isInitialized()) {\n"
            "    if (shouldMemoize) {\n"
            "      memoizedIsInitialized = 0;\n"
            "    }\n"
            "    return null;\n"
            "  }\n"
            "}\n",
            "name", info->capitalized_name);
          break;
        case FieldDescriptor::LABEL_REPEATED:
          if (IsMapEntry(field->message_type())) {
            printer->Print(
              "for ($type$ item : get$name$Map().values()) {\n"
              "  if (!item.isInitialized()) {\n"
              "    if (shouldMemoize) {\n"
              "      memoizedIsInitialized = 0;\n"
              "    }\n"
              "    return null;\n"
              "  }\n"
              "}\n",
              "type", MapValueImmutableClassdName(field->message_type(),
                                                  name_resolver_),
              "name", info->capitalized_name);
          } else {
            printer->Print(
              "for (int i = 0; i < get$name$Count(); i++) {\n"
              "  if (!get$name$(i).isInitialized()) {\n"
              "    if (shouldMemoize) {\n"
              "      memoizedIsInitialized = 0;\n"
              "    }\n"
              "    return null;\n"
              "  }\n"
              "}\n",
              "type", name_resolver_->GetImmutableClassName(
                  field->message_type()),
              "name", info->capitalized_name);
          }
          break;
      }
    }
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "if (!extensionsAreInitialized()) {\n"
      "  if (shouldMemoize) {\n"
      "    memoizedIsInitialized = 0;\n"
      "  }\n"
      "  return null;\n"
      "}\n");
  }

  printer->Print(
    "if (shouldMemoize) memoizedIsInitialized = 1;\n");

  printer->Print(
    "return DEFAULT_INSTANCE;\n"
    "\n");
}